

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

string * jsonnet::internal::jsonnet_vm_execute
                   (string *__return_storage_ptr__,Allocator *alloc,AST *ast,ExtMap *ext_vars,
                   uint max_stack,double gc_min_objects,double gc_growth_trigger,
                   VmNativeCallbackMap *natives,JsonnetImportCallback *import_callback,void *ctx,
                   bool string_output)

{
  UString *this;
  allocator<char32_t> local_29a;
  allocator<char> local_299;
  string local_298;
  UString local_278;
  UString local_258;
  LocationRange local_238;
  Interpreter vm;
  
  anon_unknown_0::Interpreter::Interpreter
            (&vm,alloc,ext_vars,max_stack,gc_min_objects,gc_growth_trigger,natives,import_callback,
             ctx);
  anon_unknown_0::Interpreter::evaluate(&vm,ast,0);
  if (string_output) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"During manifestation",(allocator<char> *)&local_258);
    LocationRange::LocationRange(&local_238,&local_298);
    (anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
              (&local_278,(Interpreter *)&vm,&local_238);
    encode_utf8(__return_storage_ptr__,&local_278);
    this = &local_278;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"During manifestation",&local_299);
    LocationRange::LocationRange(&local_238,&local_298);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_258,L"",&local_29a);
    anon_unknown_0::Interpreter::manifestJson(&local_278,&vm,&local_238,true,&local_258);
    encode_utf8(__return_storage_ptr__,&local_278);
    std::__cxx11::u32string::~u32string((u32string *)&local_278);
    this = &local_258;
  }
  std::__cxx11::u32string::~u32string((u32string *)this);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_298);
  anon_unknown_0::Interpreter::~Interpreter(&vm);
  return __return_storage_ptr__;
}

Assistant:

std::string jsonnet_vm_execute(Allocator *alloc, const AST *ast, const ExtMap &ext_vars,
                               unsigned max_stack, double gc_min_objects, double gc_growth_trigger,
                               const VmNativeCallbackMap &natives,
                               JsonnetImportCallback *import_callback, void *ctx,
                               bool string_output)
{
    Interpreter vm(alloc,
                   ext_vars,
                   max_stack,
                   gc_min_objects,
                   gc_growth_trigger,
                   natives,
                   import_callback,
                   ctx);
    vm.evaluate(ast, 0);
    if (string_output) {
        return encode_utf8(vm.manifestString(LocationRange("During manifestation")));
    } else {
        return encode_utf8(vm.manifestJson(LocationRange("During manifestation"), true, U""));
    }
}